

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsReverse(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  Abc_Obj_t *pNode;
  int iVar4;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  long *plVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar4 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar4 + 500;
    iVar10 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar10) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar10;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar4) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar10;
  }
  iVar4 = pNtk->nTravIds;
  pNtk->nTravIds = iVar4 + 1;
  if (iVar4 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    vNodes->pArray = ppvVar5;
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar11 = 0;
      uVar7 = extraout_RDX;
      do {
        plVar8 = (long *)pVVar6->pArray[lVar11];
        lVar9 = *plVar8;
        iVar4 = (int)plVar8[2];
        uVar2 = *(undefined4 *)(lVar9 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar9 + 0xe0),iVar4 + 1,(int)uVar7);
        if (((long)iVar4 < 0) || (*(int *)(lVar9 + 0xe4) <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar9 + 0xe8) + (long)iVar4 * 4) = uVar2;
        if (*(int *)*plVar8 == 1) {
          plVar8 = *(long **)(*(long *)(*(long *)((int *)*plVar8 + 8) + 8) +
                             (long)*(int *)plVar8[6] * 8);
        }
        uVar7 = extraout_RDX_00;
        if (0 < *(int *)((long)plVar8 + 0x2c)) {
          lVar9 = 0;
          do {
            Abc_NtkDfsReverse_rec
                      (*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                        (long)*(int *)(plVar8[6] + lVar9 * 4) * 8),vNodes);
            lVar9 = lVar9 + 1;
            uVar7 = extraout_RDX_01;
          } while (lVar9 < *(int *)((long)plVar8 + 0x2c));
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar11 < pVVar6->nSize);
    }
    if ((pNtk->ntkType != ABC_NTK_STRASH) && (pVVar6 = pNtk->vObjs, 0 < pVVar6->nSize)) {
      lVar11 = 0;
      do {
        pNode = (Abc_Obj_t *)pVVar6->pArray[lVar11];
        if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
          iVar4 = Abc_NodeIsConst(pNode);
          if (iVar4 != 0) {
            uVar3 = vNodes->nSize;
            if (uVar3 == vNodes->nCap) {
              if ((int)uVar3 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar5;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
                }
                vNodes->pArray = ppvVar5;
                vNodes->nCap = uVar3 * 2;
              }
            }
            else {
              ppvVar5 = vNodes->pArray;
            }
            vNodes->nSize = uVar3 + 1;
            ppvVar5[(int)uVar3] = pNode;
          }
        }
        lVar11 = lVar11 + 1;
        pVVar6 = pNtk->vObjs;
      } while (lVar11 < pVVar6->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsReverse( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pFanout;
    int i, k;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj = Abc_ObjFanout0Ntk(pObj);
        Abc_ObjForEachFanout( pObj, pFanout, k )
            Abc_NtkDfsReverse_rec( pFanout, vNodes );
    }
    // add constant nodes in the end
    if ( !Abc_NtkIsStrash(pNtk) ) {
        Abc_NtkForEachNode( pNtk, pObj, i )
            if ( Abc_NodeIsConst(pObj) )
                Vec_PtrPush( vNodes, pObj );
    }
    return vNodes;
}